

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrackinglinesearch.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
backtrackingLineSearch::optimize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          backtrackingLineSearch *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  _func_double_vector<double,_std::allocator<double>_> *p_Var2;
  _func_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_> *p_Var3;
  double *pdVar4;
  double *pdVar5;
  vector<double,_std::allocator<double>_> vVar6;
  vector<double,_std::allocator<double>_> vVar7;
  vector<double,_std::allocator<double>_> vVar8;
  vector<double,_std::allocator<double>_> vVar9;
  vector<double,_std::allocator<double>_> vVar10;
  vector<double,_std::allocator<double>_> vVar11;
  vector<double,_std::allocator<double>_> vVar12;
  pointer pdVar13;
  pointer pdVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  ostream *poVar16;
  pointer pdVar17;
  uint uVar18;
  ulong uVar19;
  vector<double,_std::allocator<double>_> *dF;
  double dVar20;
  double dVar21;
  double dVar22;
  initializer_list<double> __l;
  undefined8 in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe68;
  double *local_188;
  vector<double,_std::allocator<double>_> local_178;
  ofstream *local_160;
  ulong local_158;
  vector<double,_std::allocator<double>_> local_150;
  vector<double,_std::allocator<double>_> *local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  vector<double,_std::allocator<double>_> local_100;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  void *local_70 [2];
  long local_60;
  double local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  dVar22 = this->alpha;
  local_128 = this->alpha_dec;
  local_130 = this->alpha_inc;
  local_138 = __return_storage_ptr__;
  if ((this->super_optimizer).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial SOLUTION : (",0x14);
    poVar16 = std::ostream::_M_insert<double>
                        (*(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,",",1);
    pvVar1 = &this->x;
    poVar16 = std::ostream::_M_insert<double>
                        ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    poVar16 = std::ostream::_M_insert<double>
                        (*(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    poVar16 = std::ostream::_M_insert<double>
                        ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    p_Var2 = this->f;
    std::vector<double,_std::allocator<double>_>::vector(&local_e8,pvVar1);
    vVar6.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)dVar22;
    vVar6.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)in_stack_fffffffffffffe58;
    vVar6.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_fffffffffffffe68;
    dVar20 = (*p_Var2)(vVar6);
    poVar16 = std::ostream::_M_insert<double>(dVar20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pvVar1 = &this->x;
  local_160 = &(this->super_optimizer).logFile;
  uVar19 = 0;
  local_188 = (double *)0x0;
  pdVar17 = (pointer)0x0;
  do {
    p_Var3 = this->df;
    local_158 = uVar19;
    std::vector<double,_std::allocator<double>_>::vector(&local_150,pvVar1);
    vVar7.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)dVar22;
    vVar7.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)in_stack_fffffffffffffe58;
    vVar7.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = in_stack_fffffffffffffe68;
    (*p_Var3)((vector<double,_std::allocator<double>_> *)local_70,vVar7);
    utils::Delta(&local_178,(utils *)local_70,dF);
    pdVar14 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pdVar13 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar4 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (local_188 != (double *)0x0) {
      operator_delete(local_188,(long)pdVar17 - (long)local_188);
    }
    if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70[0] != (void *)0x0) {
      operator_delete(local_70[0],local_60 - (long)local_70[0]);
    }
    if (local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    while( true ) {
      p_Var2 = this->f;
      pdVar5 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_58 = *pdVar13 * dVar22 + *pdVar5;
      local_50 = pdVar13[1] * dVar22 + pdVar5[1];
      __l._M_len = 2;
      __l._M_array = &local_58;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_88,__l,(allocator_type *)&stack0xfffffffffffffe6f);
      vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)dVar22;
      vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe58;
      vVar8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffe68;
      dVar20 = (*p_Var2)(vVar8);
      p_Var2 = this->f;
      std::vector<double,_std::allocator<double>_>::vector(&local_a0,pvVar1);
      vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)dVar22;
      vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe58;
      vVar9.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffe68;
      dVar21 = (*p_Var2)(vVar9);
      local_108 = this->wolfe_para;
      p_Var3 = this->df;
      std::vector<double,_std::allocator<double>_>::vector(&local_b8,pvVar1);
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)dVar22;
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe58;
      vVar10.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffe68;
      (*p_Var3)(&local_178,vVar10);
      local_110 = *local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start * dVar22;
      local_118 = *pdVar13;
      p_Var3 = this->df;
      std::vector<double,_std::allocator<double>_>::vector(&local_d0,pvVar1);
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)dVar22;
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe58;
      vVar11.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffe68;
      (*p_Var3)(&local_48,vVar11);
      local_120 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] * dVar22 * pdVar13[1];
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (dVar20 <= local_108 * (local_110 * local_118 + local_120) + dVar21) break;
      dVar22 = dVar22 * local_128;
      if ((this->super_optimizer).verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Dec Alpha to: ",0xe);
        poVar16 = std::ostream::_M_insert<double>(this->alpha);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
      }
    }
    pdVar5 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar5 = *pdVar13 * dVar22 + *pdVar5;
    pdVar5[1] = pdVar13[1] * dVar22 + pdVar5[1];
    if ((this->super_optimizer).verbose != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"########### NEW SOLUTION ########### : (",0x28);
      poVar16 = std::ostream::_M_insert<double>
                          (*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,",",1);
      poVar16 = std::ostream::_M_insert<double>
                          ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      poVar16 = std::ostream::_M_insert<double>
                          (*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      poVar16 = std::ostream::_M_insert<double>
                          ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      p_Var2 = this->f;
      std::vector<double,_std::allocator<double>_>::vector(&local_100,pvVar1);
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)dVar22;
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)in_stack_fffffffffffffe58;
      vVar12.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = in_stack_fffffffffffffe68;
      dVar20 = (*p_Var2)(vVar12);
      poVar16 = std::ostream::_M_insert<double>(dVar20);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    dVar22 = dVar22 * local_130;
    dVar20 = pdVar13[1] * dVar22 * pdVar13[1] * dVar22 + *pdVar13 * dVar22 * *pdVar13 * dVar22;
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    uVar18 = (int)local_158 + (uint)(dVar20 < this->tol);
    uVar19 = (ulong)uVar18;
    pdVar17 = pdVar14;
    local_188 = pdVar4;
  } while (uVar18 < 10);
  std::ofstream::close();
  pvVar15 = local_138;
  std::vector<double,_std::allocator<double>_>::vector(local_138,pvVar1);
  operator_delete(pdVar13,(long)pdVar14 - (long)pdVar13);
  return pvVar15;
}

Assistant:

vector<double> backtrackingLineSearch::optimize(){
    uint count=0;
    //local variable for that optimization problem
    double alpha_=alpha;
    double alpha_dec_=alpha_dec;
    double alpha_inc_=alpha_inc;
    vector<double> delta;
    if (verbose!=0){
        cout << "Initial SOLUTION : ("<< x[0] << ","<< x[1]<<")"<<endl;
        logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
    }
    while (count<10){
        delta=utils::Delta(df(x));
        while (f({x[0]+alpha_*delta[0],x[1]+alpha_*delta[1]})>f(x)+wolfe_para*(df(x)[0]*alpha_*delta[0]+df(x)[1]*alpha_*delta[1])){
            alpha_*=alpha_dec_;
            if(verbose!=0) cout<<"Dec Alpha to: "<<alpha<<endl;
        }
        x[0]+=alpha_*delta[0];
        x[1]+=alpha_*delta[1];
        alpha_*=alpha_inc_;
        if (verbose!=0){
            cout << "########### NEW SOLUTION ########### : ("<< x[0] << ","<< x[1]<<")"<<endl;
            logFile<<x[0]<<" "<<x[1]<<" "<<f(x)<<endl;
        }
        // terminaltion rule for the inner loop
        if(sqrt(pow(alpha_*delta[0],2)+pow(alpha_*delta[1],2))<tol)count++;
        }
    logFile.close();
    return x;
}